

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rbnf.cpp
# Opt level: O2

UnicodeString * __thiscall
icu_63::RuleBasedNumberFormat::format
          (RuleBasedNumberFormat *this,DecimalQuantity *number,UnicodeString *appendTo,
          FieldPositionIterator *posIter,UErrorCode *status)

{
  bool bVar1;
  int64_t iVar2;
  NumberFormat *pNVar3;
  DecimalQuantity *this_00;
  size_t size;
  DecimalQuantity copy;
  Formattable f;
  
  if (U_ZERO_ERROR < *status) {
    return appendTo;
  }
  icu_63::number::impl::DecimalQuantity::DecimalQuantity(&copy,number);
  bVar1 = icu_63::number::impl::DecimalQuantity::fitsInLong(&copy,false);
  if (bVar1) {
    iVar2 = icu_63::number::impl::DecimalQuantity::toLong(number,false);
    (*(this->super_NumberFormat).super_Format.super_UObject._vptr_UObject[0x10])
              (this,iVar2,appendTo,posIter,status);
    goto LAB_002271b0;
  }
  icu_63::number::impl::DecimalQuantity::roundToMagnitude(&copy,0,UNUM_FOUND_HALFEVEN,status);
  bVar1 = icu_63::number::impl::DecimalQuantity::fitsInLong(&copy,false);
  if (bVar1) {
    icu_63::number::impl::DecimalQuantity::toDouble(number);
    (*(this->super_NumberFormat).super_Format.super_UObject._vptr_UObject[10])
              (this,appendTo,posIter,status);
    goto LAB_002271b0;
  }
  size = 1;
  pNVar3 = NumberFormat::createInstance(&this->locale,UNUM_DECIMAL,status);
  if ((pNVar3 == (NumberFormat *)0x0) && (*status < U_ILLEGAL_ARGUMENT_ERROR)) {
    *status = U_MEMORY_ALLOCATION_ERROR;
    goto LAB_002271b0;
  }
  if (pNVar3 == (NumberFormat *)0x0) goto LAB_002271b0;
  Formattable::Formattable(&f);
  this_00 = (DecimalQuantity *)UMemory::operator_new((UMemory *)0x50,size);
  if (this_00 == (DecimalQuantity *)0x0) {
    if (U_ZERO_ERROR < *status) goto LAB_00227172;
    *status = U_MEMORY_ALLOCATION_ERROR;
  }
  else {
    icu_63::number::impl::DecimalQuantity::DecimalQuantity(this_00,number);
LAB_00227172:
    if (this_00 != (DecimalQuantity *)0x0) {
      Formattable::adoptDecimalQuantity(&f,this_00);
      (*(pNVar3->super_Format).super_UObject._vptr_UObject[6])(pNVar3,&f,appendTo,posIter,status);
    }
  }
  Formattable::~Formattable(&f);
  (*(pNVar3->super_Format).super_UObject._vptr_UObject[1])(pNVar3);
LAB_002271b0:
  icu_63::number::impl::DecimalQuantity::~DecimalQuantity(&copy);
  return appendTo;
}

Assistant:

UnicodeString&
RuleBasedNumberFormat::format(const DecimalQuantity &number,
                      UnicodeString &appendTo,
                      FieldPositionIterator *posIter,
                      UErrorCode &status) const {
    if (U_FAILURE(status)) {
        return appendTo;
    }
    DecimalQuantity copy(number);
    if (copy.fitsInLong()) {
        format(number.toLong(), appendTo, posIter, status);
    }
    else {
        copy.roundToMagnitude(0, number::impl::RoundingMode::UNUM_ROUND_HALFEVEN, status);
        if (copy.fitsInLong()) {
            format(number.toDouble(), appendTo, posIter, status);
        }
        else {
            // We're outside of our normal range that this framework can handle.
            // The DecimalFormat will provide more accurate results.

            // TODO this section should probably be optimized. The DecimalFormat is shared in ICU4J.
            LocalPointer<NumberFormat> decimalFormat(NumberFormat::createInstance(locale, UNUM_DECIMAL, status), status);
            if (decimalFormat.isNull()) {
                return appendTo;
            }
            Formattable f;
            LocalPointer<DecimalQuantity> decimalQuantity(new DecimalQuantity(number), status);
            if (decimalQuantity.isNull()) {
                return appendTo;
            }
            f.adoptDecimalQuantity(decimalQuantity.orphan()); // f now owns decimalQuantity.
            decimalFormat->format(f, appendTo, posIter, status);
        }
    }
    return appendTo;
}